

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O0

int __thiscall JetHead::CircularBuffer::peekLine(CircularBuffer *this,string *line,char *terminal)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  byte *pbStack_50;
  bool found;
  uint8_t *ptr;
  int state;
  int term_len;
  AutoLock lock;
  char *terminal_local;
  string *line_local;
  CircularBuffer *this_local;
  
  lock._16_8_ = terminal;
  AutoLock::AutoLock((AutoLock *)&state,&this->mLock);
  sVar3 = strlen((char *)lock._16_8_);
  ptr._0_4_ = 0;
  pbStack_50 = this->mReadPtr;
  bVar1 = false;
  if (this->mLen == 0) {
    this_local._4_4_ = 0;
  }
  else {
    do {
      if ((uint)*pbStack_50 == (int)*(char *)(lock._16_8_ + (long)(int)ptr)) {
        ptr._0_4_ = (int)ptr + 1;
      }
      else {
        ptr._0_4_ = 0;
      }
      if ((int)ptr == (int)sVar3) {
        bVar1 = true;
        break;
      }
      pbStack_50 = pbStack_50 + 1;
      if (pbStack_50 == this->mEnd) {
        pbStack_50 = this->mBuffer;
      }
    } while (pbStack_50 != this->mWritePtr);
    if (bVar1) {
      if (pbStack_50 + 1 < this->mReadPtr) {
        std::__cxx11::string::assign((char *)line,(ulong)this->mReadPtr);
        std::__cxx11::string::append((char *)line,(ulong)this->mBuffer);
      }
      else {
        std::__cxx11::string::assign((char *)line,(ulong)this->mReadPtr);
      }
      iVar2 = std::__cxx11::string::length();
      this_local._4_4_ = iVar2 + (int)sVar3;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  AutoLock::~AutoLock((AutoLock *)&state);
  return this_local._4_4_;
}

Assistant:

int CircularBuffer::peekLine( JHSTD::string &line, const char *terminal )
{
	AutoLock lock( mLock );
	int term_len = strlen( terminal );
	int state = 0;
	uint8_t *ptr = mReadPtr;
	bool found = false;
	
	if ( mLen == 0 ) 
		return 0;
	
	do {
		if ( *ptr == terminal[ state ] )
			state += 1;
		else
			state = 0;
	
		if ( state == term_len )
		{
			found = true;
			break;
		}
		
		ptr += 1;
		if ( ptr == mEnd )
			ptr = mBuffer;
	} while( ptr != mWritePtr );
	
	if ( found )
	{
		// move passed the terminals last char, don't care about wrapping here.
		ptr += 1;

		// if wrap
		if ( ptr < mReadPtr )
		{
			line.assign( (char*)mReadPtr, mEnd - mReadPtr );
			line.append( (char*)mBuffer, ptr - mBuffer - term_len );
		}
		else
			line.assign( (char*)mReadPtr, ptr - mReadPtr - term_len );

		return line.length() + term_len;
	}

	return 0;
}